

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool Fossilize::default_get_member_bool(Value *value,char *member,bool default_value)

{
  bool bVar1;
  Value *this;
  Value *memb;
  bool default_value_local;
  char *member_local;
  Value *value_local;
  
  this = maybe_get_member(value,member);
  value_local._7_1_ = default_value;
  if ((this != (Value *)0x0) &&
     (bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsBool(this), bVar1)) {
    value_local._7_1_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetBool(this);
  }
  return (bool)value_local._7_1_;
}

Assistant:

static bool default_get_member_bool(const Value &value, const char *member, bool default_value)
{
	auto *memb = maybe_get_member(value, member);
	if (!memb)
		return default_value;
	if (!memb->IsBool())
		return default_value;
	return memb->GetBool();
}